

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Packetizer.cpp
# Opt level: O2

size_t __thiscall axl::sl::PacketizerRoot::writeImpl(PacketizerRoot *this,void *p0,size_t size0)

{
  char e;
  ulong uVar1;
  ulong count;
  size_t sVar2;
  ulong count_00;
  long lVar3;
  ulong uStack_40;
  
  uStack_40 = (this->m_buffer).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count;
  lVar3 = -size0;
  while (uStack_40 < 4) {
    if (lVar3 == 0) goto LAB_00117e45;
    e = *p0;
    if (e == *(char *)((long)&writeImpl::signatureBuffer + uStack_40)) {
      Array<char,_axl::sl::ArrayDetails<char>_>::append(&this->m_buffer,e,1);
      uStack_40 = uStack_40 + 1;
    }
    else if ((uStack_40 == 0) ||
            (Array<char,_axl::sl::ArrayDetails<char>_>::clear(&this->m_buffer), e != '\x02')) {
      uStack_40 = 0;
    }
    else {
      uStack_40 = 1;
      Array<char,_axl::sl::ArrayDetails<char>_>::copy
                (&this->m_buffer,(EVP_PKEY_CTX *)0x2,(EVP_PKEY_CTX *)0x1);
    }
    p0 = (void *)((long)p0 + 1);
    lVar3 = lVar3 + 1;
  }
  count_00 = -lVar3;
  if (uStack_40 < 8) {
    if (8 - uStack_40 <= count_00) {
      Array<char,_axl::sl::ArrayDetails<char>_>::append(&this->m_buffer,(char *)p0,8 - uStack_40);
      p0 = (void *)((long)p0 + (8 - uStack_40));
      count_00 = (uStack_40 - lVar3) - 8;
      uStack_40 = 8;
      goto LAB_00117e23;
    }
LAB_00117e3a:
    Array<char,_axl::sl::ArrayDetails<char>_>::append(&this->m_buffer,(char *)p0,count_00);
LAB_00117e45:
    sVar2 = 0xffffffffffffffff;
  }
  else {
LAB_00117e23:
    uVar1 = (ulong)(*(int *)((this->m_buffer).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p
                            + 4) + 8);
    count = uVar1 - uStack_40;
    if (uStack_40 <= uVar1 && count != 0) {
      if (count_00 < count) goto LAB_00117e3a;
      Array<char,_axl::sl::ArrayDetails<char>_>::append(&this->m_buffer,(char *)p0,count);
      count_00 = count_00 - count;
    }
    sVar2 = size0 - count_00;
  }
  return sVar2;
}

Assistant:

size_t
PacketizerRoot::writeImpl(
	const void* p0,
	size_t size0
) {
	const char* p = (char*)p0;
	size_t size = size0;
	size_t bufferSize = m_buffer.getCount();

	static uint32_t signatureBuffer = PacketHdrSignature;
	const char* signature = (char*)&signatureBuffer;

	while (bufferSize < sizeof(uint32_t)) { // append signature byte-by-byte
		if (!size)
			return -1; // all is buffered

		char c = *p;

		if (c == signature[bufferSize]) {
			m_buffer.append(c);
			bufferSize++;
		} else if (bufferSize) {
			m_buffer.clear();
			bufferSize = 0;

			if (c == signature[0]) {
				m_buffer.copy(c);
				bufferSize = 1;
			}
		}

		p++;
		size--;
	}

	if (bufferSize < sizeof(uint64_t)) { // packet size
		size_t chunkSize = sizeof(uint64_t) - bufferSize;
		if (size < chunkSize) {
			m_buffer.append(p, size);
			return -1; // all is buffered
		}

		m_buffer.append(p, chunkSize);
		p += chunkSize;
		size -= chunkSize;

		bufferSize = sizeof(uint64_t);
	}

	uint32_t dataSize = ((const uint32_t*)m_buffer.cp()) [1];
	uint32_t packetSize = sizeof(uint64_t) + dataSize;

	if (bufferSize < packetSize) {
		size_t chunkSize = packetSize - bufferSize;
		if (size < chunkSize) {
			m_buffer.append(p, size);
			return -1; // all is buffered
		}

		m_buffer.append(p, chunkSize);
		p += chunkSize;
		size -= chunkSize;
	}

	ASSERT(size0 >= size);
	return size0 - size;
}